

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O1

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,uint radix)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  byte bVar10;
  bool bVar11;
  
  uVar9 = CONCAT44(0,radix);
  uVar6 = 0;
  do {
    if (this->end_ <= this->cursor_ + uVar6) break;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = number;
    bVar5 = SUB161(auVar4 % auVar3,0);
    bVar10 = bVar5 + 0x57;
    if (SUB168(auVar4 % auVar3,0) < 10) {
      bVar10 = bVar5 | 0x30;
    }
    this->cursor_[uVar6] = bVar10;
    uVar6 = uVar6 + 1;
    bVar11 = uVar9 <= number;
    number = number / uVar9;
  } while (bVar11);
  pcVar2 = this->cursor_;
  pcVar7 = pcVar2 + ((ulong)uVar6 - 1);
  if (pcVar2 < pcVar7 && uVar6 != 0) {
    do {
      pcVar8 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar7;
      *pcVar7 = cVar1;
      pcVar7 = pcVar7 + -1;
      pcVar2 = pcVar8;
    } while (pcVar8 < pcVar7);
  }
  this->cursor_ = this->cursor_ + uVar6;
  return;
}

Assistant:

void AppendUint64(uint64 number, unsigned radix) {
    unsigned i = 0;
    while (cursor_ + i < end_) {
      const uint64 tmp = number % radix;
      number /= radix;
      cursor_[i] = static_cast<char>(tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }